

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuttongroup.cpp
# Opt level: O0

void __thiscall QButtonGroup::removeButton(QButtonGroup *this,QAbstractButton *button)

{
  long lVar1;
  bool bVar2;
  QButtonGroupPrivate *this_00;
  QAbstractButtonPrivate *pQVar3;
  QButtonGroupPrivate *in_RSI;
  QButtonGroup *in_RDI;
  long in_FS_OFFSET;
  QButtonGroupPrivate *d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QButtonGroup *)0x51025e);
  bVar2 = ::operator==((QPointer<QAbstractButton> *)this_00,(QAbstractButton **)in_RDI);
  if (bVar2) {
    QButtonGroupPrivate::detectCheckedButton(in_RSI);
  }
  pQVar3 = QAbstractButton::d_func((QAbstractButton *)0x510293);
  if (pQVar3->group == in_RDI) {
    pQVar3 = QAbstractButton::d_func((QAbstractButton *)0x5102aa);
    pQVar3->group = (QButtonGroup *)0x0;
    QList<QAbstractButton*>::removeAll<QAbstractButton*>
              ((QList<QAbstractButton_*> *)this_00,(QAbstractButton **)in_RDI);
    QHash<QAbstractButton_*,_int>::remove(&this_00->mapping,&stack0xfffffffffffffff0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QButtonGroup::removeButton(QAbstractButton *button)
{
    Q_D(QButtonGroup);
    if (d->checkedButton == button) {
        d->detectCheckedButton();
    }
    if (button->d_func()->group == this) {
        button->d_func()->group = nullptr;
        d->buttonList.removeAll(button);
        d->mapping.remove(button);
    }
}